

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O3

void __thiscall OpenMD::HullFinder::HullFinder(HullFinder *this,SimInfo *info)

{
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *this_00;
  pointer *pppSVar1;
  iterator __position;
  Atom *pAVar2;
  RigidBody *pRVar3;
  Bond *pBVar4;
  Bend *pBVar5;
  Torsion *pTVar6;
  Inversion *pIVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *this_01;
  SimInfo *pSVar9;
  Molecule *pMVar10;
  pointer ppAVar11;
  pointer ppRVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  int *piVar17;
  iterator iVar18;
  pointer ppSVar19;
  MoleculeIterator mi;
  MoleculeIterator local_68;
  vector<int,_std::allocator<int>_> *local_60;
  StuntDouble *local_58;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *local_50;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *local_48;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_40;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *local_38;
  
  this->info_ = info;
  this_00 = &this->stuntdoubles_;
  local_48 = &this->bonds_;
  local_50 = &this->bends_;
  local_40 = &this->molecules_;
  local_38 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)&this->localSites_
  ;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(this_00,0,0xa8);
  this_01 = local_48;
  local_68._M_node._0_4_ = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  local_60 = &this->nObjects_;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&this->nObjects_,(iterator)0x0,(int *)&local_68);
  pSVar9 = this->info_;
  iVar18._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68._M_node._0_4_ = pSVar9->nGlobalBonds_;
  piVar17 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar18._M_current == piVar17) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar18,(int *)&local_68)
    ;
    pSVar9 = this->info_;
    iVar18._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar17 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar18._M_current = (int)local_68._M_node;
    iVar18._M_current = iVar18._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar18._M_current;
  }
  local_68._M_node._0_4_ = pSVar9->nGlobalBends_;
  if (iVar18._M_current == piVar17) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar18,(int *)&local_68)
    ;
    pSVar9 = this->info_;
    iVar18._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar17 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar18._M_current = (int)local_68._M_node;
    iVar18._M_current = iVar18._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar18._M_current;
  }
  local_68._M_node._0_4_ = pSVar9->nGlobalTorsions_;
  if (iVar18._M_current == piVar17) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar18,(int *)&local_68)
    ;
    pSVar9 = this->info_;
    iVar18._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar17 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar18._M_current = (int)local_68._M_node;
    iVar18._M_current = iVar18._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar18._M_current;
  }
  local_68._M_node._0_4_ = pSVar9->nGlobalInversions_;
  if (iVar18._M_current == piVar17) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar18,(int *)&local_68)
    ;
    pSVar9 = this->info_;
    iVar18._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar17 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar18._M_current = (int)local_68._M_node;
    iVar18._M_current = iVar18._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar18._M_current;
  }
  pvVar8 = local_60;
  local_68._M_node._0_4_ = pSVar9->nGlobalMols_;
  if (iVar18._M_current == piVar17) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar18,(int *)&local_68)
    ;
  }
  else {
    *iVar18._M_current = pSVar9->nGlobalMols_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar18._M_current + 1;
  }
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            (this_00,(long)*(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            (this_01,(long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            (local_50,(long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[2]);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            (&this->torsions_,
             (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[3]);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            (&this->inversions_,
             (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[4]);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            (local_40,(long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[5]);
  local_68._M_node = (_Base_ptr)0x0;
  pMVar10 = SimInfo::beginMolecule(this->info_,&local_68);
  do {
    if (pMVar10 == (Molecule *)0x0) {
      return;
    }
    (local_40->super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>)._M_impl.
    super__Vector_impl_data._M_start[pMVar10->globalIndex_] = pMVar10;
    ppSVar19 = (pMVar10->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar19 ==
        (pMVar10->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001ea1ef:
      local_58 = (StuntDouble *)0x0;
    }
    else {
      local_58 = *ppSVar19;
      if (local_58 != (StuntDouble *)0x0) {
        do {
          ppSVar19 = ppSVar19 + 1;
          __position._M_current =
               (this->localSites_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->localSites_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
            _M_realloc_insert<OpenMD::StuntDouble*const&>(local_38,__position,&local_58);
          }
          else {
            *__position._M_current = local_58;
            pppSVar1 = &(this->localSites_).
                        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + 1;
          }
          if (ppSVar19 ==
              (pMVar10->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_001ea1ef;
          local_58 = *ppSVar19;
        } while (local_58 != (StuntDouble *)0x0);
        local_58 = (StuntDouble *)0x0;
      }
    }
    ppAVar11 = (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar11 !=
        (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pAVar2 = *ppAVar11;
      while (pAVar2 != (Atom *)0x0) {
        ppAVar11 = ppAVar11 + 1;
        (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>)
        ._M_impl.super__Vector_impl_data._M_start[(pAVar2->super_StuntDouble).globalIndex_] =
             &pAVar2->super_StuntDouble;
        if (ppAVar11 ==
            (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pAVar2 = *ppAVar11;
      }
    }
    ppRVar12 = (pMVar10->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar12 !=
        (pMVar10->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar3 = *ppRVar12;
      while (pRVar3 != (RigidBody *)0x0) {
        ppRVar12 = ppRVar12 + 1;
        (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>)
        ._M_impl.super__Vector_impl_data._M_start[(pRVar3->super_StuntDouble).globalIndex_] =
             &pRVar3->super_StuntDouble;
        if (ppRVar12 ==
            (pMVar10->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pRVar3 = *ppRVar12;
      }
    }
    ppBVar13 = (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppBVar13 !=
        (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pBVar4 = *ppBVar13;
      while (pBVar4 != (Bond *)0x0) {
        ppBVar13 = ppBVar13 + 1;
        (local_48->super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>)._M_impl.
        super__Vector_impl_data._M_start[(pBVar4->super_ShortRangeInteraction).globalIndex_] =
             pBVar4;
        if (ppBVar13 ==
            (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pBVar4 = *ppBVar13;
      }
    }
    ppBVar14 = (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppBVar14 !=
        (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pBVar5 = *ppBVar14;
      while (pBVar5 != (Bend *)0x0) {
        ppBVar14 = ppBVar14 + 1;
        (local_50->super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>)._M_impl.
        super__Vector_impl_data._M_start[(pBVar5->super_ShortRangeInteraction).globalIndex_] =
             pBVar5;
        if (ppBVar14 ==
            (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pBVar5 = *ppBVar14;
      }
    }
    ppTVar15 = (pMVar10->torsions_).
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppTVar15 !=
        (pMVar10->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pTVar6 = *ppTVar15;
      while (pTVar6 != (Torsion *)0x0) {
        ppTVar15 = ppTVar15 + 1;
        (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
        _M_impl.super__Vector_impl_data._M_start[(pTVar6->super_ShortRangeInteraction).globalIndex_]
             = pTVar6;
        if (ppTVar15 ==
            (pMVar10->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pTVar6 = *ppTVar15;
      }
    }
    ppIVar16 = (pMVar10->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppIVar16 !=
        (pMVar10->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar7 = *ppIVar16;
      while (pIVar7 != (Inversion *)0x0) {
        ppIVar16 = ppIVar16 + 1;
        (this->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start[(pIVar7->super_ShortRangeInteraction).globalIndex_] =
             pIVar7;
        if (ppIVar16 ==
            (pMVar10->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pIVar7 = *ppIVar16;
      }
    }
    pMVar10 = SimInfo::nextMolecule(this->info_,&local_68);
  } while( true );
}

Assistant:

HullFinder::HullFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      // Hull is constructed from all known integrable objects.
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        localSites_.push_back(sd);
      }

      // selection can include atoms (which may be a subset of the IOs)
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }

      // and rigid bodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }

      // These others are going to be inferred from the objects on the hull:
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
#ifdef HAVE_QHULL
    surfaceMesh_ = new ConvexHull();
#endif
  }